

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O1

bool __thiscall ON__LayerExtensions::CopyFrom(ON__LayerExtensions *this,ON_Object *src)

{
  bool bVar1;
  ON_UserData *src_00;
  
  if (src == (ON_Object *)0x0) {
    src_00 = (ON_UserData *)0x0;
  }
  else {
    bVar1 = ON_Object::IsKindOf(src,&m_ON__LayerExtensions_class_rtti);
    src_00 = (ON_UserData *)0x0;
    if (bVar1) {
      src_00 = (ON_UserData *)src;
    }
  }
  if (src_00 != (ON_UserData *)0x0) {
    ON_UserData::operator=(&this->super_ON_UserData,src_00);
    ON_SimpleArray<ON__LayerPerViewSettings>::operator=
              (&this->m_vp_settings,(ON_SimpleArray<ON__LayerPerViewSettings> *)(src_00 + 1));
  }
  return src_00 != (ON_UserData *)0x0;
}

Assistant:

ON__LayerExtensions* ON__LayerExtensions::LayerExtensions(const ON_Layer& layer, const unsigned char* layer_m_extension_bits, bool bCreate)
{
  ON__LayerExtensions* ud = ON__LayerExtensions::Cast(layer.GetUserData(ON_CLASS_ID(ON__LayerExtensions)));

  if ( 0 == ud )
  {
    if ( bCreate )
    {
      ud = new ON__LayerExtensions();
      const_cast<ON_Layer&>(layer).AttachUserData(ud);
      // Clear 0x01 bit of ON_Layer::m_extension_bits so 
      // ON_Layer visibility and color queries will check
      // for ON__LayerExtensions userdata.
      ClearExtensionBit( const_cast<unsigned char*>(layer_m_extension_bits), 0x01 );
    }
    else
    {
      // Set 0x01 bit of ON_Layer::m_extension_bits so 
      // ON_Layer visibility and color queries will not
      // perform the expensive check for ON__LayerExtensions 
      // userdata. This speeds up visibility and color queries 
      // that occur millions of times when complicated models
      // are rendered.
      SetExtensionBit( const_cast<unsigned char*>(layer_m_extension_bits), 0x01 );
    }
  }
  else
  {
    // Clear 0x01 bit of ON_Layer::m_extension_bits so 
    // ON_Layer visibility and color queries will check
    // for ON__LayerExtensions userdata.
    ClearExtensionBit( const_cast<unsigned char*>(layer_m_extension_bits), 0x01 );
  }

  return ud;
}